

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O0

void __thiscall
coro_io::
callback_awaitor_base<async_simple::Try<std::pair<std::error_code,unsigned_long>>,coro_io::callback_awaitor<async_simple::Try<std::pair<std::error_code,unsigned_long>>>>
::awaitor_handler::set_value<std::pair<std::error_code,unsigned_long>>
          (awaitor_handler *this,pair<std::error_code,_unsigned_long> *args)

{
  pair<std::error_code,_unsigned_long> *in_RDI;
  Try<std::pair<std::error_code,_unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::
  Try<std::pair<std::error_code,_unsigned_long>_>(in_stack_ffffffffffffffd0,in_RDI);
  async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::operator=
            (in_stack_ffffffffffffffd0,(Try<std::pair<std::error_code,_unsigned_long>_> *)in_RDI);
  async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::~Try
            ((Try<std::pair<std::error_code,_unsigned_long>_> *)0x18c4b5);
  return;
}

Assistant:

void set_value(Args &&...args) const {
      if constexpr (!std::is_void_v<Arg>) {
        obj->arg_ = {std::forward<Args>(args)...};
      }
    }